

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.c
# Opt level: O0

_Bool test_mul(void)

{
  FILE *__stream;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t m2;
  uint8_t m1;
  uint8_t c_1;
  uint8_t b_2;
  uint8_t a_2;
  int i_5;
  uint8_t rightm;
  uint8_t leftm;
  uint8_t c;
  uint8_t b_1;
  uint8_t a_1;
  int i_4;
  uint8_t b;
  uint8_t a;
  int i_3;
  uint8_t rr;
  uint8_t rl;
  int i_2;
  char seenr [256];
  char seenl [256];
  int e;
  uint8_t r;
  int i_1;
  int res2;
  int res1;
  int i;
  _Bool success;
  int local_258;
  int local_24c;
  int local_244;
  int local_23c;
  char local_238 [256];
  char local_138 [268];
  int local_2c;
  byte local_25;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  byte local_11;
  
  local_11 = 1;
  uVar1 = gf256_mul('\0','\0');
  if (uVar1 == '\0') {
    uVar1 = gf256_mul('\0','\0');
    if (uVar1 == '\0') {
      uVar1 = gf256_mul('\0','\0');
      if (uVar1 == '\0') goto LAB_0010150a;
    }
  }
  fprintf(_stderr,"  nonzero result from 0*x or x*0.\n");
  local_11 = 0;
LAB_0010150a:
  for (local_18 = 0; (int)local_18 < 0x100; local_18 = local_18 + 1) {
    bVar2 = gf256_mul('\0','\0');
    local_1c = (uint)bVar2;
    bVar2 = gf256_mul('\0','\0');
    local_20 = (uint)bVar2;
    if (local_1c != local_18) {
      fprintf(_stderr,"  1 * %d == %d !\n",(ulong)local_18,(ulong)local_1c);
      local_11 = 0;
    }
    if (local_20 != local_18) {
      fprintf(_stderr,"  1 * %d == %d !\n",(ulong)local_18,(ulong)local_20);
      local_11 = 0;
    }
  }
  for (local_24 = 0; (int)local_24 < 0x100; local_24 = local_24 + 1) {
    local_25 = (byte)local_24;
    for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
      local_25 = gf256_mul('\0','\0');
    }
    if (local_25 != local_24) {
      fprintf(_stderr,"  %d^256 == %d\n",(ulong)local_24,(ulong)local_25);
      local_11 = 0;
    }
  }
  memset(local_138,0,0x100);
  memset(local_238,0,0x100);
  for (local_23c = 0; local_23c < 0x100; local_23c = local_23c + 1) {
    bVar2 = gf256_mul('\0','\0');
    bVar3 = gf256_mul('\0','\0');
    if ((local_138[bVar2] != '\0') || (local_238[bVar3] != '\0')) {
      fprintf(_stderr," x |-> cst * x is not one-on-one\n");
      local_11 = 0;
    }
    local_138[bVar2] = '\x01';
    local_238[bVar3] = '\x01';
  }
  for (local_244 = 0; local_244 < 100; local_244 = local_244 + 1) {
    uVar5 = rand();
    uVar6 = rand();
    uVar1 = gf256_mul('\0','\0');
    uVar4 = gf256_mul('\0','\0');
    __stream = _stderr;
    if (uVar1 != uVar4) {
      bVar2 = gf256_mul('\0','\0');
      bVar3 = gf256_mul('\0','\0');
      fprintf(__stream,"  %d * %d = %d, but %d * %d = %d\n",(ulong)(uVar5 & 0xff),
              (ulong)(uVar6 & 0xff),(ulong)bVar2,(ulong)(uVar6 & 0xff),uVar5 & 0xff,(uint)bVar3);
      local_11 = 0;
    }
  }
  for (local_24c = 0; local_24c < 100; local_24c = local_24c + 1) {
    uVar5 = rand();
    uVar6 = rand();
    uVar7 = rand();
    gf256_mul('\0','\0');
    bVar2 = gf256_mul('\0','\0');
    gf256_mul('\0','\0');
    bVar3 = gf256_mul('\0','\0');
    if (bVar2 != bVar3) {
      fprintf(_stderr,"  (%d * %d) * %d == %d, but %d * (%d * %d) == %d\n",(ulong)(byte)uVar5,
              (ulong)(byte)uVar6,(ulong)(byte)uVar7,(ulong)bVar2,uVar5 & 0xff,uVar6 & 0xff,
              uVar7 & 0xff,(uint)bVar3);
      local_11 = 0;
    }
  }
  for (local_258 = 0; local_258 < 100; local_258 = local_258 + 1) {
    uVar5 = rand();
    uVar6 = rand();
    uVar7 = rand();
    gf256_add((byte)uVar6,(byte)uVar7);
    bVar2 = gf256_mul('\0','\0');
    uVar1 = gf256_mul('\0','\0');
    uVar4 = gf256_mul('\0','\0');
    bVar3 = gf256_add(uVar1,uVar4);
    if (bVar2 != bVar3) {
      fprintf(_stderr,"  %d * (%d + %d) = %d, but %d * %d + %d * %d = %d\n",(ulong)(byte)uVar5,
              (ulong)(byte)uVar6,(ulong)(byte)uVar7,(ulong)bVar2,uVar5 & 0xff,uVar6 & 0xff,
              uVar5 & 0xff,uVar7 & 0xff,(uint)bVar3);
      local_11 = 0;
    }
  }
  return (_Bool)(local_11 & 1);
}

Assistant:

static bool test_mul()
{
	bool success = true;

	/* Multiplication against 0 checks */
	if (gf256_mul(0, 0) != 0
	  || gf256_mul(26, 0) != 0
	  || gf256_mul(0, 143) != 0)
	{
		fprintf(stderr, "  nonzero result from 0*x or x*0.\n");
		success = false;
	}

	/* 1 * x and x * 1 */
	for (int i = 0; i <= 255; ++i) {
		const int res1 = gf256_mul(1, i);
		const int res2 = gf256_mul(i, 1);
		if (res1 != i) {
			fprintf(stderr, "  1 * %d == %d !\n", i, res1);
			success = false;
		}
		if (res2 != i) {
			fprintf(stderr, "  1 * %d == %d !\n", i, res2);
			success = false;
		}
	}

	/* Check that x**256 == x */
	for (int i = 0; i <= 255; ++i) {
		uint8_t r = i;
		for (int e = 0; e < 8; ++e) {
			r = gf256_mul(r, r);
		}
		if (r != i) {
			fprintf(stderr, "  %d^256 == %d\n", i, (int)r);
			success = false;
		}
	}

	/* Multiplication by a nonzero constant is bijective */
	{
		char seenl[256] = { 0 };
		char seenr[256] = { 0 };
		for (int i = 0; i < 256; ++i) {
			const uint8_t rl = gf256_mul(57, i);
			const uint8_t rr = gf256_mul(i, 185);
			if (seenl[rl] || seenr[rr]) {
				fprintf(stderr,
				  " x |-> cst * x is not one-on-one\n");
				success = false;
			}
			seenl[rl] = 1;
			seenr[rr] = 1;
		}
	}

	/* Multiplication is commutative */
	for (int i = 0; i < 100; ++i) {
		uint8_t a = rand();
		uint8_t b = rand();
		if (gf256_mul(a, b) != gf256_mul(b, a)) {
			fprintf(stderr, "  %d * %d = %d, but %d * %d = %d\n",
			  a, b, gf256_mul(a, b), b, a, gf256_mul(b, a));
			success = false;
		}
	}

	/* Multiplication is associative */
	for (int i = 0; i < 100; ++i) {
		const uint8_t a = rand();
		const uint8_t b = rand();
		const uint8_t c = rand();

		const uint8_t leftm = gf256_mul(gf256_mul(a, b), c);
		const uint8_t rightm = gf256_mul(a, gf256_mul(b, c));

		if (leftm != rightm) {
			fprintf(stderr, "  (%d * %d) * %d == %d, "
			   "but %d * (%d * %d) == %d\n",
			   a, b, c, leftm,
			   a, b, c, rightm);
			success = false;
		}
	}

	/* Multiplication is distributive */
	for (int i = 0; i < 100; ++i) {
		const uint8_t a = rand();
		const uint8_t b = rand();
		const uint8_t c = rand();

		const uint8_t m1 = gf256_mul(a, gf256_add(b, c));
		const uint8_t m2 = gf256_add(gf256_mul(a, b), gf256_mul(a, c));
		if (m1 != m2) {
			fprintf(stderr, "  %d * (%d + %d) = %d, but "
			  "%d * %d + %d * %d = %d\n",
			  a, b, c, m1,
			  a, b, a, c, m2);
			success = false;
		}
	}

	return success;
}